

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

void __thiscall
crnlib::
hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
::rehash(hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
         *this,uint new_hash_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint32 uVar31;
  ulong uVar32;
  ulong uVar33;
  void *pvVar34;
  undefined1 *puVar35;
  long lVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  raw_node *p;
  raw_node *prVar41;
  undefined4 uVar42;
  undefined4 uVar44;
  undefined1 auVar43 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar64;
  int iVar67;
  int iVar68;
  undefined1 auVar65 [16];
  int iVar69;
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar83;
  int iVar87;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  elemental_vector local_48;
  uint local_38;
  undefined8 local_30;
  
  if ((this->m_num_valid <= new_hash_size) && ((this->m_values).m_size != new_hash_size)) {
    local_48.m_p = (void *)0x0;
    local_48.m_size = 0;
    local_48.m_capacity = 0;
    local_38 = 0x20;
    local_30 = 0;
    uVar40 = 0x20;
    if (new_hash_size != 0) {
      elemental_vector::increase_capacity
                (&local_48,new_hash_size,new_hash_size == 1,0x44,
                 vector<crnlib::hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>::raw_node>
                 ::object_mover,false);
      auVar30 = _DAT_001a70c0;
      auVar29 = _DAT_001a70b0;
      auVar28 = _DAT_001a70a0;
      auVar27 = _DAT_001a7090;
      auVar26 = _DAT_001a7080;
      auVar25 = _DAT_001a7020;
      auVar24 = _DAT_001a7010;
      if (new_hash_size - local_48.m_size != 0) {
        uVar32 = (ulong)(new_hash_size - local_48.m_size) * 0x44 - 0x44;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar32;
        uVar42 = SUB164(auVar65 * ZEXT816(0xf0f0f0f0f0f0f0f1),8);
        uVar44 = (undefined4)(uVar32 / 0x110000000);
        auVar70._0_8_ = CONCAT44(uVar44,uVar42);
        auVar70._8_4_ = uVar42;
        auVar70._12_4_ = uVar44;
        auVar43._0_8_ = auVar70._0_8_ >> 6;
        auVar43._8_8_ = auVar70._8_8_ >> 6;
        puVar35 = (undefined1 *)((long)local_48.m_p + (ulong)local_48.m_size * 0x44 + 0x43d);
        uVar33 = 0;
        do {
          auVar62._8_4_ = (int)uVar33;
          auVar62._0_8_ = uVar33;
          auVar62._12_4_ = (int)(uVar33 >> 0x20);
          auVar65 = auVar43 ^ auVar25;
          auVar70 = (auVar62 | auVar24) ^ auVar25;
          iVar64 = auVar65._0_4_;
          iVar83 = -(uint)(iVar64 < auVar70._0_4_);
          iVar67 = auVar65._4_4_;
          auVar72._4_4_ = -(uint)(iVar67 < auVar70._4_4_);
          iVar68 = auVar65._8_4_;
          iVar87 = -(uint)(iVar68 < auVar70._8_4_);
          iVar69 = auVar65._12_4_;
          auVar72._12_4_ = -(uint)(iVar69 < auVar70._12_4_);
          auVar54._4_4_ = iVar83;
          auVar54._0_4_ = iVar83;
          auVar54._8_4_ = iVar87;
          auVar54._12_4_ = iVar87;
          auVar65 = pshuflw(in_XMM1,auVar54,0xe8);
          auVar71._4_4_ = -(uint)(auVar70._4_4_ == iVar67);
          auVar71._12_4_ = -(uint)(auVar70._12_4_ == iVar69);
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar54 = pshuflw(in_XMM2,auVar71,0xe8);
          auVar72._0_4_ = auVar72._4_4_;
          auVar72._8_4_ = auVar72._12_4_;
          auVar70 = pshuflw(auVar65,auVar72,0xe8);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar70 | auVar54 & auVar65) ^ auVar45;
          auVar65 = packssdw(auVar45,auVar45);
          if ((auVar65 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar35[-0x3fc] = 0;
          }
          auVar11._4_4_ = iVar83;
          auVar11._0_4_ = iVar83;
          auVar11._8_4_ = iVar87;
          auVar11._12_4_ = iVar87;
          auVar72 = auVar71 & auVar11 | auVar72;
          auVar65 = packssdw(auVar72,auVar72);
          auVar1._8_4_ = 0xffffffff;
          auVar1._0_8_ = 0xffffffffffffffff;
          auVar1._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar1,auVar65 ^ auVar1);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._0_4_ >> 8 & 1) != 0) {
            puVar35[-0x3b8] = 0;
          }
          auVar65 = (auVar62 | auVar30) ^ auVar25;
          auVar55._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar55._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar55._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar55._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar73._4_4_ = auVar55._0_4_;
          auVar73._0_4_ = auVar55._0_4_;
          auVar73._8_4_ = auVar55._8_4_;
          auVar73._12_4_ = auVar55._8_4_;
          iVar83 = -(uint)(auVar65._4_4_ == iVar67);
          iVar87 = -(uint)(auVar65._12_4_ == iVar69);
          auVar12._4_4_ = iVar83;
          auVar12._0_4_ = iVar83;
          auVar12._8_4_ = iVar87;
          auVar12._12_4_ = iVar87;
          auVar84._4_4_ = auVar55._4_4_;
          auVar84._0_4_ = auVar55._4_4_;
          auVar84._8_4_ = auVar55._12_4_;
          auVar84._12_4_ = auVar55._12_4_;
          auVar65 = auVar12 & auVar73 | auVar84;
          auVar65 = packssdw(auVar65,auVar65);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar2,auVar65 ^ auVar2);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._0_4_ >> 0x10 & 1) != 0) {
            puVar35[-0x374] = 0;
          }
          auVar65 = pshufhw(auVar65,auVar73,0x84);
          auVar13._4_4_ = iVar83;
          auVar13._0_4_ = iVar83;
          auVar13._8_4_ = iVar87;
          auVar13._12_4_ = iVar87;
          auVar45 = pshufhw(auVar55,auVar13,0x84);
          auVar70 = pshufhw(auVar65,auVar84,0x84);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar46 = (auVar70 | auVar45 & auVar65) ^ auVar46;
          auVar65 = packssdw(auVar46,auVar46);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._0_4_ >> 0x18 & 1) != 0) {
            puVar35[-0x330] = 0;
          }
          auVar65 = (auVar62 | auVar29) ^ auVar25;
          auVar56._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar56._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar56._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar56._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar14._4_4_ = auVar56._0_4_;
          auVar14._0_4_ = auVar56._0_4_;
          auVar14._8_4_ = auVar56._8_4_;
          auVar14._12_4_ = auVar56._8_4_;
          auVar45 = pshuflw(auVar84,auVar14,0xe8);
          auVar47._0_4_ = -(uint)(auVar65._0_4_ == iVar64);
          auVar47._4_4_ = -(uint)(auVar65._4_4_ == iVar67);
          auVar47._8_4_ = -(uint)(auVar65._8_4_ == iVar68);
          auVar47._12_4_ = -(uint)(auVar65._12_4_ == iVar69);
          auVar74._4_4_ = auVar47._4_4_;
          auVar74._0_4_ = auVar47._4_4_;
          auVar74._8_4_ = auVar47._12_4_;
          auVar74._12_4_ = auVar47._12_4_;
          auVar65 = pshuflw(auVar47,auVar74,0xe8);
          auVar75._4_4_ = auVar56._4_4_;
          auVar75._0_4_ = auVar56._4_4_;
          auVar75._8_4_ = auVar56._12_4_;
          auVar75._12_4_ = auVar56._12_4_;
          auVar70 = pshuflw(auVar56,auVar75,0xe8);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 & auVar45,(auVar70 | auVar65 & auVar45) ^ auVar3);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar35[-0x2ec] = 0;
          }
          auVar15._4_4_ = auVar56._0_4_;
          auVar15._0_4_ = auVar56._0_4_;
          auVar15._8_4_ = auVar56._8_4_;
          auVar15._12_4_ = auVar56._8_4_;
          auVar75 = auVar74 & auVar15 | auVar75;
          auVar70 = packssdw(auVar75,auVar75);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65,auVar70 ^ auVar4);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._4_2_ >> 8 & 1) != 0) {
            puVar35[-0x2a8] = 0;
          }
          auVar65 = (auVar62 | auVar28) ^ auVar25;
          auVar57._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar57._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar57._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar57._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar76._4_4_ = auVar57._0_4_;
          auVar76._0_4_ = auVar57._0_4_;
          auVar76._8_4_ = auVar57._8_4_;
          auVar76._12_4_ = auVar57._8_4_;
          iVar83 = -(uint)(auVar65._4_4_ == iVar67);
          iVar87 = -(uint)(auVar65._12_4_ == iVar69);
          auVar16._4_4_ = iVar83;
          auVar16._0_4_ = iVar83;
          auVar16._8_4_ = iVar87;
          auVar16._12_4_ = iVar87;
          auVar85._4_4_ = auVar57._4_4_;
          auVar85._0_4_ = auVar57._4_4_;
          auVar85._8_4_ = auVar57._12_4_;
          auVar85._12_4_ = auVar57._12_4_;
          auVar65 = auVar16 & auVar76 | auVar85;
          auVar65 = packssdw(auVar65,auVar65);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar5,auVar65 ^ auVar5);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar35[-0x264] = 0;
          }
          auVar65 = pshufhw(auVar65,auVar76,0x84);
          auVar17._4_4_ = iVar83;
          auVar17._0_4_ = iVar83;
          auVar17._8_4_ = iVar87;
          auVar17._12_4_ = iVar87;
          auVar45 = pshufhw(auVar57,auVar17,0x84);
          auVar70 = pshufhw(auVar65,auVar85,0x84);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar70 | auVar45 & auVar65) ^ auVar48;
          auVar65 = packssdw(auVar48,auVar48);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._6_2_ >> 8 & 1) != 0) {
            puVar35[-0x220] = 0;
          }
          auVar65 = (auVar62 | auVar27) ^ auVar25;
          auVar58._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar58._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar58._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar58._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar18._4_4_ = auVar58._0_4_;
          auVar18._0_4_ = auVar58._0_4_;
          auVar18._8_4_ = auVar58._8_4_;
          auVar18._12_4_ = auVar58._8_4_;
          auVar45 = pshuflw(auVar85,auVar18,0xe8);
          auVar49._0_4_ = -(uint)(auVar65._0_4_ == iVar64);
          auVar49._4_4_ = -(uint)(auVar65._4_4_ == iVar67);
          auVar49._8_4_ = -(uint)(auVar65._8_4_ == iVar68);
          auVar49._12_4_ = -(uint)(auVar65._12_4_ == iVar69);
          auVar77._4_4_ = auVar49._4_4_;
          auVar77._0_4_ = auVar49._4_4_;
          auVar77._8_4_ = auVar49._12_4_;
          auVar77._12_4_ = auVar49._12_4_;
          auVar65 = pshuflw(auVar49,auVar77,0xe8);
          auVar78._4_4_ = auVar58._4_4_;
          auVar78._0_4_ = auVar58._4_4_;
          auVar78._8_4_ = auVar58._12_4_;
          auVar78._12_4_ = auVar58._12_4_;
          auVar70 = pshuflw(auVar58,auVar78,0xe8);
          auVar59._8_4_ = 0xffffffff;
          auVar59._0_8_ = 0xffffffffffffffff;
          auVar59._12_4_ = 0xffffffff;
          auVar59 = (auVar70 | auVar65 & auVar45) ^ auVar59;
          auVar70 = packssdw(auVar59,auVar59);
          auVar65 = packsswb(auVar65 & auVar45,auVar70);
          if ((auVar65 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar35[-0x1dc] = 0;
          }
          auVar19._4_4_ = auVar58._0_4_;
          auVar19._0_4_ = auVar58._0_4_;
          auVar19._8_4_ = auVar58._8_4_;
          auVar19._12_4_ = auVar58._8_4_;
          auVar78 = auVar77 & auVar19 | auVar78;
          auVar70 = packssdw(auVar78,auVar78);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar70 = packssdw(auVar70 ^ auVar6,auVar70 ^ auVar6);
          auVar65 = packsswb(auVar65,auVar70);
          if ((auVar65._8_2_ >> 8 & 1) != 0) {
            puVar35[-0x198] = 0;
          }
          auVar65 = (auVar62 | auVar26) ^ auVar25;
          auVar60._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar60._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar60._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar60._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar79._4_4_ = auVar60._0_4_;
          auVar79._0_4_ = auVar60._0_4_;
          auVar79._8_4_ = auVar60._8_4_;
          auVar79._12_4_ = auVar60._8_4_;
          iVar83 = -(uint)(auVar65._4_4_ == iVar67);
          iVar87 = -(uint)(auVar65._12_4_ == iVar69);
          auVar20._4_4_ = iVar83;
          auVar20._0_4_ = iVar83;
          auVar20._8_4_ = iVar87;
          auVar20._12_4_ = iVar87;
          auVar86._4_4_ = auVar60._4_4_;
          auVar86._0_4_ = auVar60._4_4_;
          auVar86._8_4_ = auVar60._12_4_;
          auVar86._12_4_ = auVar60._12_4_;
          auVar65 = auVar20 & auVar79 | auVar86;
          auVar65 = packssdw(auVar65,auVar65);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar7,auVar65 ^ auVar7);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar35[-0x154] = 0;
          }
          auVar65 = pshufhw(auVar65,auVar79,0x84);
          auVar21._4_4_ = iVar83;
          auVar21._0_4_ = iVar83;
          auVar21._8_4_ = iVar87;
          auVar21._12_4_ = iVar87;
          auVar45 = pshufhw(auVar60,auVar21,0x84);
          auVar70 = pshufhw(auVar65,auVar86,0x84);
          auVar50._8_4_ = 0xffffffff;
          auVar50._0_8_ = 0xffffffffffffffff;
          auVar50._12_4_ = 0xffffffff;
          auVar50 = (auVar70 | auVar45 & auVar65) ^ auVar50;
          auVar65 = packssdw(auVar50,auVar50);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._10_2_ >> 8 & 1) != 0) {
            puVar35[-0x110] = 0;
          }
          auVar65 = (auVar62 | _DAT_001a7070) ^ auVar25;
          auVar61._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar61._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar61._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar61._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar22._4_4_ = auVar61._0_4_;
          auVar22._0_4_ = auVar61._0_4_;
          auVar22._8_4_ = auVar61._8_4_;
          auVar22._12_4_ = auVar61._8_4_;
          auVar45 = pshuflw(auVar86,auVar22,0xe8);
          auVar51._0_4_ = -(uint)(auVar65._0_4_ == iVar64);
          auVar51._4_4_ = -(uint)(auVar65._4_4_ == iVar67);
          auVar51._8_4_ = -(uint)(auVar65._8_4_ == iVar68);
          auVar51._12_4_ = -(uint)(auVar65._12_4_ == iVar69);
          auVar80._4_4_ = auVar51._4_4_;
          auVar80._0_4_ = auVar51._4_4_;
          auVar80._8_4_ = auVar51._12_4_;
          auVar80._12_4_ = auVar51._12_4_;
          auVar65 = pshuflw(auVar51,auVar80,0xe8);
          auVar81._4_4_ = auVar61._4_4_;
          auVar81._0_4_ = auVar61._4_4_;
          auVar81._8_4_ = auVar61._12_4_;
          auVar81._12_4_ = auVar61._12_4_;
          auVar70 = pshuflw(auVar61,auVar81,0xe8);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 & auVar45,(auVar70 | auVar65 & auVar45) ^ auVar8);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar35[-0xcc] = 0;
          }
          auVar23._4_4_ = auVar61._0_4_;
          auVar23._0_4_ = auVar61._0_4_;
          auVar23._8_4_ = auVar61._8_4_;
          auVar23._12_4_ = auVar61._8_4_;
          auVar81 = auVar80 & auVar23 | auVar81;
          auVar70 = packssdw(auVar81,auVar81);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65,auVar70 ^ auVar9);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65._12_2_ >> 8 & 1) != 0) {
            puVar35[-0x88] = 0;
          }
          auVar65 = (auVar62 | _DAT_001a7060) ^ auVar25;
          auVar52._0_4_ = -(uint)(iVar64 < auVar65._0_4_);
          auVar52._4_4_ = -(uint)(iVar67 < auVar65._4_4_);
          auVar52._8_4_ = -(uint)(iVar68 < auVar65._8_4_);
          auVar52._12_4_ = -(uint)(iVar69 < auVar65._12_4_);
          auVar82._4_4_ = auVar52._0_4_;
          auVar82._0_4_ = auVar52._0_4_;
          auVar82._8_4_ = auVar52._8_4_;
          auVar82._12_4_ = auVar52._8_4_;
          auVar63._4_4_ = -(uint)(auVar65._4_4_ == iVar67);
          auVar63._12_4_ = -(uint)(auVar65._12_4_ == iVar69);
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar66._4_4_ = auVar52._4_4_;
          auVar66._0_4_ = auVar52._4_4_;
          auVar66._8_4_ = auVar52._12_4_;
          auVar66._12_4_ = auVar52._12_4_;
          auVar70 = auVar63 & auVar82 | auVar66;
          auVar65 = packssdw(auVar52,auVar70);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar10,auVar65 ^ auVar10);
          auVar65 = packsswb(auVar65,auVar65);
          if ((auVar65 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar35[-0x44] = 0;
          }
          auVar65 = pshufhw(auVar65,auVar82,0x84);
          in_XMM2 = pshufhw(auVar70,auVar63,0x84);
          in_XMM2 = in_XMM2 & auVar65;
          auVar65 = pshufhw(auVar65,auVar66,0x84);
          auVar53._8_4_ = 0xffffffff;
          auVar53._0_8_ = 0xffffffffffffffff;
          auVar53._12_4_ = 0xffffffff;
          auVar53 = (auVar65 | in_XMM2) ^ auVar53;
          auVar65 = packssdw(auVar53,auVar53);
          in_XMM1 = packsswb(auVar65,auVar65);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            *puVar35 = 0;
          }
          uVar33 = uVar33 + 0x10;
          puVar35 = puVar35 + 0x440;
        } while ((uVar32 / 0x44 + 0x10 & 0xfffffffffffffff0) != uVar33);
      }
      local_48.m_size = new_hash_size;
      if (new_hash_size != 1) {
        uVar40 = 0x20;
        uVar32 = (ulong)new_hash_size;
        do {
          uVar40 = uVar40 - 1;
          uVar37 = (uint)uVar32;
          uVar32 = uVar32 >> 1;
        } while (3 < uVar37);
      }
    }
    local_30._4_4_ = 0xffffffff;
    p = (this->m_values).m_p;
    uVar32 = (ulong)(this->m_values).m_size;
    local_38 = uVar40;
    if (uVar32 != 0) {
      prVar41 = p + uVar32;
      do {
        if (p->m_bits[0x41] != '\0') {
          uVar31 = fast_hash(p,0x40);
          uVar37 = uVar31 * -0x61c88647 >> ((byte)local_38 & 0x1f);
          pvVar34 = (void *)((long)local_48.m_p + (ulong)uVar37 * 0x44);
          if (*(char *)((long)local_48.m_p + (ulong)uVar37 * 0x44 + 0x41) != '\0') {
            uVar39 = uVar37;
            do {
              uVar38 = uVar39 - 1;
              if (uVar39 == 0) {
                uVar38 = local_48.m_size - 1;
              }
              if (uVar38 == uVar37) goto LAB_00106e59;
              pvVar34 = (void *)((long)pvVar34 + -0x44);
              if (uVar39 == 0) {
                pvVar34 = (void *)((long)local_48.m_p + (ulong)(local_48.m_size - 1) * 0x44);
              }
              uVar39 = uVar38;
            } while (*(char *)((long)pvVar34 + 0x41) != '\0');
          }
          lVar36 = 0;
          do {
            *(uint8 *)((long)pvVar34 + lVar36 * 4) = p->m_bits[lVar36 * 4];
            *(uint8 *)((long)pvVar34 + lVar36 * 4 + 1) = p->m_bits[lVar36 * 4 + 1];
            *(uint8 *)((long)pvVar34 + lVar36 * 4 + 2) = p->m_bits[lVar36 * 4 + 2];
            *(uint8 *)((long)pvVar34 + lVar36 * 4 + 3) = p->m_bits[lVar36 * 4 + 3];
            lVar36 = lVar36 + 1;
          } while (lVar36 != 0x10);
          *(uint8 *)((long)pvVar34 + 0x40) = p->m_bits[0x40];
          *(undefined1 *)((long)pvVar34 + 0x41) = 1;
          p->m_bits[0x41] = '\0';
          local_30._0_4_ = (uint)local_30 + 1;
LAB_00106e59:
          if ((uint)local_30 == this->m_num_valid) break;
        }
        p = p + 1;
      } while (p != prVar41);
      p = (this->m_values).m_p;
    }
    local_30._4_4_ = new_hash_size + 1 >> 1;
    if (p != (raw_node *)0x0) {
      crnlib_free(p);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    (this->m_values).m_p = (raw_node *)local_48.m_p;
    (this->m_values).m_size = local_48.m_size;
    (this->m_values).m_capacity = local_48.m_capacity;
    this->m_hash_shift = local_38;
    this->m_num_valid = (uint)local_30;
    this->m_grow_threshold = local_30._4_4_;
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size)
        {
            CRNLIB_ASSERT(new_hash_size >= m_num_valid);
            CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

            if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
            {
                return;
            }

            hash_map new_map;
            new_map.m_values.resize(new_hash_size);
            new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
            CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
            new_map.m_grow_threshold = UINT_MAX;

            node* pNode = reinterpret_cast<node*>(m_values.begin());
            node* pNode_end = pNode + m_values.size();

            while (pNode != pNode_end)
            {
                if (pNode->state)
                {
                    new_map.move_into(pNode);

                    if (new_map.m_num_valid == m_num_valid)
                    {
                        break;
                    }
                }

                pNode++;
            }

            new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

            m_values.clear_no_destruction();
            m_hash_shift = 32;

            swap(new_map);
        }